

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialog::setOptions(QColorDialog *this,ColorDialogOptions options)

{
  bool bVar1;
  ColorDialogOptions lhs;
  Int IVar2;
  QColorDialogPrivate *pQVar3;
  QColorDialogOptions *pQVar4;
  Int in_ESI;
  long in_FS_OFFSET;
  QColorDialogPrivate *d;
  QColorDialogPrivate *in_stack_000002c0;
  undefined4 in_stack_ffffffffffffff88;
  ColorDialogOption in_stack_ffffffffffffff8c;
  QColorDialogPrivate *in_stack_ffffffffffffff90;
  QPushButton *this_00;
  QColorDialog *in_stack_ffffffffffffff98;
  QDialogButtonBox *pQVar5;
  byte local_49;
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> local_28;
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> local_24;
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> local_20;
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> local_1c;
  QFlag local_18 [2];
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> local_10;
  QFlagsStorage<QColorDialog::ColorDialogOption> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = in_ESI;
  pQVar3 = d_func((QColorDialog *)0x739cfe);
  lhs = QColorDialog::options(in_stack_ffffffffffffff98);
  local_10.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
       (QFlagsStorage<QColorDialog::ColorDialogOption>)
       (QFlagsStorage<QColorDialog::ColorDialogOption>)local_c.i;
  bVar1 = ::operator==((QFlags<QColorDialog::ColorDialogOption>)
                       lhs.super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
                       super_QFlagsStorage<QColorDialog::ColorDialogOption>.i,
                       (QFlags<QColorDialog::ColorDialogOption>)local_c.i);
  if (!bVar1) {
    pQVar4 = QSharedPointer<QColorDialogOptions>::operator->
                       ((QSharedPointer<QColorDialogOptions> *)0x739d42);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    QFlag::QFlag(local_18,IVar2);
    QFlags<QColorDialogOptions::ColorDialogOption>::QFlagsStorageHelper
              ((QFlags<QColorDialogOptions::ColorDialogOption> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (QFlag)(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    QColorDialogOptions::setOptions((QFlags_conflict1 *)pQVar4);
    local_1c.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
         (QFlagsStorage<QColorDialog::ColorDialogOption>)
         QFlags<QColorDialog::ColorDialogOption>::operator&
                   ((QFlags<QColorDialog::ColorDialogOption> *)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff8c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    local_49 = 0;
    if (IVar2 != 0) {
      local_49 = (pQVar3->super_QDialogPrivate).nativeDialogInUse;
    }
    if ((local_49 & 1) != 0) {
      (pQVar3->super_QDialogPrivate).nativeDialogInUse = false;
      QColorDialogPrivate::initWidgets(in_stack_000002c0);
    }
    if (((pQVar3->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
      pQVar5 = pQVar3->buttons;
      local_20.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
           (QFlagsStorage<QColorDialog::ColorDialogOption>)
           QFlags<QColorDialog::ColorDialogOption>::operator&
                     ((QFlags<QColorDialog::ColorDialogOption> *)in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff8c);
      bVar1 = QFlags<QColorDialog::ColorDialogOption>::operator!
                        ((QFlags<QColorDialog::ColorDialogOption> *)&local_20);
      (**(code **)(*(long *)&pQVar5->super_QWidget + 0x68))(pQVar5,bVar1);
      local_24.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
           (QFlagsStorage<QColorDialog::ColorDialogOption>)
           QFlags<QColorDialog::ColorDialogOption>::operator&
                     ((QFlags<QColorDialog::ColorDialogOption> *)in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff8c);
      ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
      QColorDialogPrivate::showAlpha
                (in_stack_ffffffffffffff90,SUB41(in_stack_ffffffffffffff8c >> 0x18,0));
      if (pQVar3->eyeDropperButton != (QPushButton *)0x0) {
        this_00 = pQVar3->eyeDropperButton;
        local_28.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
             (QFlagsStorage<QColorDialog::ColorDialogOption>)
             QFlags<QColorDialog::ColorDialogOption>::operator&
                       ((QFlags<QColorDialog::ColorDialogOption> *)this_00,in_stack_ffffffffffffff8c
                       );
        bVar1 = QFlags<QColorDialog::ColorDialogOption>::operator!
                          ((QFlags<QColorDialog::ColorDialogOption> *)&local_28);
        (**(code **)(*(long *)&(this_00->super_QAbstractButton).super_QWidget + 0x68))
                  (this_00,bVar1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorDialog::setOptions(ColorDialogOptions options)
{
    Q_D(QColorDialog);

    if (QColorDialog::options() == options)
        return;

    d->options->setOptions(QColorDialogOptions::ColorDialogOptions(int(options)));
    if ((options & DontUseNativeDialog) && d->nativeDialogInUse) {
        d->nativeDialogInUse = false;
        d->initWidgets();
    }
    if (!d->nativeDialogInUse) {
        d->buttons->setVisible(!(options & NoButtons));
        d->showAlpha(options & ShowAlphaChannel);
        if (d->eyeDropperButton)
            d->eyeDropperButton->setVisible(!(options & NoEyeDropperButton));
    }
}